

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-common.h
# Opt level: O0

size_t aesgcm_decrypt(ptls_aead_context_t *_ctx,void *output,void *input,size_t inlen,void *iv,
                     void *aad,size_t aadlen)

{
  int iVar1;
  size_t tag_offset;
  aesgcm_context_t *ctx;
  void *aad_local;
  void *iv_local;
  size_t inlen_local;
  void *input_local;
  void *output_local;
  ptls_aead_context_t *_ctx_local;
  
  if (inlen < 0x10) {
    _ctx_local = (ptls_aead_context_t *)0xffffffffffffffff;
  }
  else {
    _ctx_local = (ptls_aead_context_t *)(inlen - 0x10);
    iVar1 = cf_gcm_decrypt(&cf_aes,_ctx + 1,(uint8_t *)input,(size_t)_ctx_local,(uint8_t *)aad,
                           aadlen,(uint8_t *)iv,0xc,(uint8_t *)((long)input + (long)_ctx_local),0x10
                           ,(uint8_t *)output);
    if (iVar1 != 0) {
      _ctx_local = (ptls_aead_context_t *)0xffffffffffffffff;
    }
  }
  return (size_t)_ctx_local;
}

Assistant:

static inline size_t aesgcm_decrypt(ptls_aead_context_t *_ctx, void *output, const void *input, size_t inlen, const void *iv,
                             const void *aad, size_t aadlen)
{
    struct aesgcm_context_t *ctx = (struct aesgcm_context_t *)_ctx;

    if (inlen < PTLS_AESGCM_TAG_SIZE)
        return SIZE_MAX;
    size_t tag_offset = inlen - PTLS_AESGCM_TAG_SIZE;

    if (cf_gcm_decrypt(&cf_aes, &ctx->aes, input, tag_offset, aad, aadlen, iv, PTLS_AESGCM_IV_SIZE, (uint8_t *)input + tag_offset,
                       PTLS_AESGCM_TAG_SIZE, output) != 0)
        return SIZE_MAX;

    return tag_offset;
}